

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QList<QWidgetItemData>_>::insert
          (QMovableArrayOps<QList<QWidgetItemData>_> *this,qsizetype i,qsizetype n,parameter_type t)

{
  QList<QWidgetItemData> **ppQVar1;
  qsizetype *pqVar2;
  long lVar3;
  qsizetype inserts;
  QList<QWidgetItemData> *pQVar4;
  long in_FS_OFFSET;
  bool bVar5;
  QArrayDataPointer<QWidgetItemData> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d = (t->d).d;
  local_48.ptr = (t->d).ptr;
  local_48.size = (t->d).size;
  if (local_48.d != (Data *)0x0) {
    LOCK();
    ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  bVar5 = (this->super_QGenericArrayOps<QList<QWidgetItemData>_>).
          super_QArrayDataPointer<QList<QWidgetItemData>_>.size != 0;
  QArrayDataPointer<QList<QWidgetItemData>_>::detachAndGrow
            ((QArrayDataPointer<QList<QWidgetItemData>_> *)this,(uint)(i == 0 && bVar5),n,
             (QList<QWidgetItemData> **)0x0,(QArrayDataPointer<QList<QWidgetItemData>_> *)0x0);
  if (i == 0 && bVar5) {
    for (; n != 0; n = n + -1) {
      pQVar4 = (this->super_QGenericArrayOps<QList<QWidgetItemData>_>).
               super_QArrayDataPointer<QList<QWidgetItemData>_>.ptr;
      pQVar4[-1].d.d = local_48.d;
      pQVar4[-1].d.ptr = local_48.ptr;
      pQVar4[-1].d.size = local_48.size;
      if (local_48.d != (Data *)0x0) {
        LOCK();
        ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      ppQVar1 = &(this->super_QGenericArrayOps<QList<QWidgetItemData>_>).
                 super_QArrayDataPointer<QList<QWidgetItemData>_>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<QList<QWidgetItemData>_>).
                super_QArrayDataPointer<QList<QWidgetItemData>_>.size;
      *pqVar2 = *pqVar2 + 1;
    }
  }
  else {
    pQVar4 = (this->super_QGenericArrayOps<QList<QWidgetItemData>_>).
             super_QArrayDataPointer<QList<QWidgetItemData>_>.ptr + i;
    memmove(pQVar4 + n,pQVar4,
            ((this->super_QGenericArrayOps<QList<QWidgetItemData>_>).
             super_QArrayDataPointer<QList<QWidgetItemData>_>.size - i) * 0x18);
    lVar3 = n;
    if (n != 0) {
      do {
        (pQVar4->d).d = local_48.d;
        (pQVar4->d).ptr = local_48.ptr;
        (pQVar4->d).size = local_48.size;
        if (local_48.d != (Data *)0x0) {
          LOCK();
          ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        lVar3 = lVar3 + -1;
        pQVar4 = pQVar4 + 1;
      } while (lVar3 != 0);
    }
    pqVar2 = &(this->super_QGenericArrayOps<QList<QWidgetItemData>_>).
              super_QArrayDataPointer<QList<QWidgetItemData>_>.size;
    *pqVar2 = *pqVar2 + n;
  }
  QArrayDataPointer<QWidgetItemData>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }